

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::remapNonEntryPointIO(HlslParseContext *this,TFunction *function)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  TType *pTVar4;
  undefined4 extraout_var_02;
  uint uVar5;
  ulong uVar6;
  HlslParseContext *this_00;
  
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if (iVar2 != 0) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))();
    *(byte *)(lVar3 + 0x10) = *(byte *)(lVar3 + 0x10) & 0xf0;
    *(undefined8 *)(lVar3 + 0x14) = 0xffffffffffffffff;
    uVar1 = *(ulong *)(lVar3 + 8);
    *(undefined1 *)(lVar3 + 0x2d) = 0;
    uVar6 = 0;
    if ((uVar1 & 0x1ff0000) == 0) {
      uVar6 = (ulong)(((uint)uVar1 & 0xff80) << 9);
    }
    *(ulong *)(lVar3 + 8) = uVar1 & 0x1fffc01f1fff007f | uVar6;
    *(ulong *)(lVar3 + 0x1c) =
         (ulong)((uint)*(undefined8 *)(lVar3 + 0x1c) & 0xffc00000) | 0xffffffff001fcfff;
    *(ulong *)(lVar3 + 0x24) = *(ulong *)(lVar3 + 0x24) | 0xff7fffffff;
  }
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      this_00 = (HlslParseContext *)function;
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar5);
      pTVar4 = getStructBufferContentType(this_00,*(TType **)(CONCAT44(extraout_var_01,iVar2) + 8));
      if (pTVar4 == (TType *)0x0) {
        iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar5);
        lVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar2) + 8) + 0x50))();
        *(byte *)(lVar3 + 0x10) = *(byte *)(lVar3 + 0x10) & 0xf0;
        *(undefined8 *)(lVar3 + 0x14) = 0xffffffffffffffff;
        uVar1 = *(ulong *)(lVar3 + 8);
        *(undefined1 *)(lVar3 + 0x2d) = 0;
        uVar6 = (ulong)(((uint)uVar1 & 0xff80) << 9);
        if ((uVar1 & 0x1ff0000) != 0) {
          uVar6 = 0;
        }
        *(ulong *)(lVar3 + 8) = uVar1 & 0x1fffc01f1fff007f | uVar6;
        *(ulong *)(lVar3 + 0x1c) =
             (ulong)((uint)*(undefined8 *)(lVar3 + 0x1c) & 0xffc00000) | 0xffffffff001fcfff;
        *(ulong *)(lVar3 + 0x24) = *(ulong *)(lVar3 + 0x24) | 0xff7fffffff;
      }
      uVar5 = uVar5 + 1;
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar5 < iVar2);
  }
  return;
}

Assistant:

void HlslParseContext::remapNonEntryPointIO(TFunction& function)
{
    // return value
    if (function.getType().getBasicType() != EbtVoid)
        clearUniformInputOutput(function.getWritableType().getQualifier());

    // parameters.
    // References to structuredbuffer types are left unmodified
    for (int i = 0; i < function.getParamCount(); i++)
        if (!isReference(*function[i].type))
            clearUniformInputOutput(function[i].type->getQualifier());
}